

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCut.c
# Opt level: O3

void Abc_NtkCutsSubtractFanunt(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pNode;
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Abc_Obj_t *pAVar3;
  uint uVar4;
  long lVar5;
  Abc_Obj_t *pFan0;
  Abc_Obj_t *pFan1;
  byte local_40;
  undefined7 uStack_3f;
  Abc_Obj_t *local_38;
  
  pVVar2 = pNtk->vObjs;
  if (pVVar2->nSize < 1) {
    uVar4 = 0;
  }
  else {
    lVar5 = 0;
    uVar4 = 0;
    do {
      pNode = (Abc_Obj_t *)pVVar2->pArray[lVar5];
      if ((pNode != (Abc_Obj_t *)0x0) && (iVar1 = Abc_NodeIsMuxType(pNode), iVar1 != 0)) {
        pAVar3 = Abc_NodeRecognizeMux(pNode,&local_38,(Abc_Obj_t **)&local_40);
        local_40 = local_40 & 0xfe;
        iVar1 = *(int *)(((ulong)pAVar3 & 0xfffffffffffffffe) + 0x2c);
        if (iVar1 < 2) {
          __assert_fail("pFanC->vFanouts.nSize > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcCut.c"
                        ,0x41,"void Abc_NtkCutsSubtractFanunt(Abc_Ntk_t *)");
        }
        *(int *)(((ulong)pAVar3 & 0xfffffffffffffffe) + 0x2c) = iVar1 + -1;
        iVar1 = Abc_NodeIsExorType(pNode);
        if (iVar1 == 0) {
          uVar4 = uVar4 + 1;
        }
        else {
          iVar1 = *(int *)(CONCAT71(uStack_3f,local_40) + 0x2c);
          if (iVar1 < 2) {
            __assert_fail("pFan0->vFanouts.nSize > 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcCut.c"
                          ,0x46,"void Abc_NtkCutsSubtractFanunt(Abc_Ntk_t *)");
          }
          *(int *)(CONCAT71(uStack_3f,local_40) + 0x2c) = iVar1 + -1;
          uVar4 = uVar4 + 2;
        }
      }
      lVar5 = lVar5 + 1;
      pVVar2 = pNtk->vObjs;
    } while (lVar5 < pVVar2->nSize);
  }
  printf("Substracted %d fanouts\n",(ulong)uVar4);
  return;
}

Assistant:

void Abc_NtkCutsSubtractFanunt( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pFan0, * pFan1, * pFanC;
    int i, Counter = 0;
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        if ( !Abc_NodeIsMuxType(pObj) )
            continue;
        pFanC = Abc_NodeRecognizeMux( pObj, &pFan1, &pFan0 );
        pFanC = Abc_ObjRegular(pFanC);
        pFan0 = Abc_ObjRegular(pFan0);
        assert( pFanC->vFanouts.nSize > 1 );
        pFanC->vFanouts.nSize--;
        Counter++;
        if ( Abc_NodeIsExorType(pObj) )
        {
            assert( pFan0->vFanouts.nSize > 1 );
            pFan0->vFanouts.nSize--;
            Counter++;
        }
    }
    printf("Substracted %d fanouts\n", Counter );
}